

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O3

void __thiscall
gl4cts::FunctionObject::
tenary<tcu::Vector<double,_4>,_const_tcu::Vector<double,_4>_&,_const_tcu::Vector<double,_4>_&,_double>
::call(tenary<tcu::Vector<double,_4>,_const_tcu::Vector<double,_4>_&,_const_tcu::Vector<double,_4>_&,_double>
       *this,GLvoid *result_dst,GLvoid *argument_src)

{
  GLuint GVar1;
  GLuint i;
  GLuint argument;
  GLuint result;
  uint uVar2;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  
  argument = 0;
  GPUShaderFP64Test10::functionObject::getArgumentStride((functionObject *)this,0);
  uVar2 = 0;
  do {
    GVar1 = GPUShaderFP64Test10::functionObject::getArgumentStride((functionObject *)this,argument);
    uVar2 = uVar2 + GVar1;
    argument = argument + 1;
  } while (argument != 2);
  (*(code *)(this->super_tenaryBase).super_functionObject.m_p_function)
            ((int)*(undefined8 *)((long)argument_src + (ulong)uVar2),&local_50);
  *(undefined8 *)((long)result_dst + 0x10) = local_40;
  *(undefined8 *)((long)result_dst + 0x18) = uStack_38;
  *(undefined8 *)result_dst = local_50;
  *(undefined8 *)((long)result_dst + 8) = uStack_48;
  return;
}

Assistant:

virtual void call(glw::GLvoid* result_dst, const glw::GLvoid* argument_src) const
	{
		const glw::GLuint argument_2_offset = getArgumentOffset(1);
		const glw::GLuint argument_3_offset = getArgumentOffset(2);

		functionPointer p_function = (functionPointer)m_p_function;

		arg1T arg_1;
		arg2T arg_2;
		arg3T arg_3;
		ResT  result;

		unpack<arg1T>::get(argument_src, arg_1);
		unpack<arg2T>::get((glw::GLubyte*)argument_src + argument_2_offset, arg_2);
		unpack<arg3T>::get((glw::GLubyte*)argument_src + argument_3_offset, arg_3);

		result = p_function(arg_1, arg_2, arg_3);

		pack<ResT>::set(result_dst, result);
	}